

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureHelper::qt_TextureParameterf
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLenum pname
          ,GLfloat param)

{
  long in_FS_OFFSET;
  undefined1 local_38 [12];
  GLint GStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffd0 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b4087::TextureBinder::TextureBinder
            ((TextureBinder *)local_38,this->functions,texture,target,bindingTarget);
  (**(code **)(*(long *)this->functions + 0x148))(param,target,pname);
  (*(code *)**(undefined8 **)local_38._0_8_)((ulong)stack0xffffffffffffffd0 & 0xffffffff,GStack_2c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureParameterf(GLuint texture, GLenum target, GLenum bindingTarget, GLenum pname, GLfloat param)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexParameterf(target, pname, param);
}